

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_spectrum.cpp
# Opt level: O0

Spectrum * window_standards::load_spectrum(Spectrum *__return_storage_ptr__,istream *input)

{
  bool bVar1;
  istream *piVar2;
  size_type sVar3;
  const_reference pvVar4;
  pair<double,_double> pVar5;
  double local_160;
  double local_158;
  pair<double,_double> local_150;
  undefined1 local_140 [8];
  string val;
  string wl;
  smatch matches;
  regex pattern;
  undefined1 local_b8 [8];
  string description;
  undefined1 local_78 [8];
  string line_lower;
  double local_48;
  double multiplier;
  string line;
  istream *input_local;
  Spectrum *spectrum;
  
  line.field_2._M_local_buf[0xf] = '\0';
  Spectrum::Spectrum(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&multiplier);
  local_48 = 1.0;
  __return_storage_ptr__->type = FILE;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)&multiplier);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) {
      line.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::~string((string *)&multiplier);
      if ((line.field_2._M_local_buf[0xf] & 1U) == 0) {
        Spectrum::~Spectrum(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)(description.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&multiplier);
    to_lower((string *)local_78,(string *)((long)&description.field_2 + 8));
    std::__cxx11::string::~string((string *)(description.field_2._M_local_buf + 8));
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"description",0);
    if (sVar3 == 0xffffffffffffffff) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,"type",0);
      if (sVar3 == 0xffffffffffffffff) {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     "wavelength units",0);
        if (sVar3 == 0xffffffffffffffff) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin,
                     "\\s*(\\S+)\\s+(\\S+)\\s*",0x10);
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)((long)&wl.field_2 + 8));
          bVar1 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &multiplier,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)((long)&wl.field_2 + 8),
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             &matches._M_begin,0);
          if (bVar1) {
            pvVar4 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)((long)&wl.field_2 + 8),1);
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str((string_type *)((long)&val.field_2 + 8),pvVar4);
            pvVar4 = std::__cxx11::
                     match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)((long)&wl.field_2 + 8),2);
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str((string_type *)local_140,pvVar4);
            local_158 = std::__cxx11::stod((string *)((long)&val.field_2 + 8),(size_t *)0x0);
            local_158 = local_158 * local_48;
            local_160 = std::__cxx11::stod((string *)local_140,(size_t *)0x0);
            pVar5 = std::make_pair<double,double>(&local_158,&local_160);
            local_150 = pVar5;
            std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            push_back(&__return_storage_ptr__->values,&local_150);
            std::__cxx11::string::~string((string *)local_140);
            std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)((long)&wl.field_2 + 8));
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&matches._M_begin);
        }
        else {
          sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,"nanometer",0);
          if (sVar3 == 0xffffffffffffffff) {
            sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_78,"nm",0);
            if (sVar3 == 0xffffffffffffffff) goto LAB_00165795;
          }
          local_48 = local_48 * 0.001;
        }
      }
    }
    else {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &multiplier,":",0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&multiplier,
                 sVar3 + 2,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&__return_storage_ptr__->description,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::__cxx11::string::~string((string *)local_b8);
    }
LAB_00165795:
    std::__cxx11::string::~string((string *)local_78);
  } while( true );
}

Assistant:

Spectrum load_spectrum(std::istream & input)
    {
        Spectrum spectrum;
        std::string line;
        double multiplier = 1.0;

        spectrum.type = Spectrum_Type::FILE;

        while(std::getline(input, line))
        {
            std::string line_lower = to_lower(line);
            if(line_lower.find("description") != std::string::npos)
            {
                std::string description = line.substr(line.find(":") + 2);
                spectrum.description = description;
                continue;
            }
            if(line_lower.find("type") != std::string::npos)
            {
                continue;
            }
            if(line_lower.find("wavelength units") != std::string::npos)
            {
                if((line_lower.find("nanometer") != std::string::npos) || (line_lower.find("nm") != std::string::npos))
                {
                    multiplier *= .001;
                }
                continue;
            }

            std::regex pattern("\\s*(\\S+)\\s+(\\S+)\\s*");
            std::smatch matches;

            if(std::regex_search(line, matches, pattern))
            {
                std::string wl = matches[1].str();
                std::string val = matches[2].str();
                spectrum.values.push_back(std::make_pair<double, double>(std::stod(wl) * multiplier, std::stod(val)));
            }
        }

        return spectrum;
    }